

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::generateValues
               (BufferLayout *layout,
               vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
               *blockPointers,deUint32 seed)

{
  int iVar1;
  DataType dataType;
  int iVar2;
  int iVar3;
  pointer pBVar4;
  pointer pBVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  DataType DVar10;
  int iVar11;
  int iVar12;
  deUint32 dVar13;
  ulong uVar14;
  ulong uVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  pointer pBVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,seed);
  uVar14 = (ulong)((long)(layout->blocks).
                         super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(layout->blocks).
                        super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar15 = uVar14 & 0xffffffff;
  if ((int)uVar14 < 1) {
    uVar15 = 0;
  }
  uVar14 = 0;
  do {
    if (uVar14 == uVar15) {
      return;
    }
    pBVar25 = (blockPointers->
              super__Vector_base<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar14;
    pBVar4 = (layout->blocks).
             super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar16 = &pBVar4[uVar14].activeVarIndices;
    uVar22 = (ulong)((long)*(pointer *)
                            ((long)&pBVar4[uVar14].activeVarIndices.
                                    super__Vector_base<int,_std::allocator<int>_> + 8) -
                    *(long *)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl) >> 2
    ;
    uVar23 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar23 = 0;
    }
    for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
      iVar1 = *(int *)(*(long *)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                      uVar22 * 4);
      pBVar5 = (layout->bufferVars).
               super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = pBVar25->lastUnsizedArraySize;
      pvVar6 = pBVar25->ptr;
      DVar10 = glu::getDataTypeScalarType(pBVar5[iVar1].type);
      iVar11 = glu::getDataTypeScalarSize(pBVar5[iVar1].type);
      uVar7 = pBVar5[iVar1].arraySize;
      if (pBVar5[iVar1].arraySize == 0) {
        uVar7 = uVar24;
      }
      uVar17 = (ulong)uVar7;
      dataType = pBVar5[iVar1].type;
      iVar2 = pBVar5[iVar1].arrayStride;
      uVar8 = pBVar5[iVar1].topLevelArraySize;
      if (pBVar5[iVar1].topLevelArraySize == 0) {
        uVar8 = uVar24;
      }
      uVar18 = (ulong)uVar8;
      iVar3 = pBVar5[iVar1].topLevelArrayStride;
      bVar30 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar31 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar12 = 1;
      if (bVar31 || bVar30) {
        if (pBVar5[iVar1].isRowMajor == true) {
          iVar12 = glu::getDataTypeMatrixNumRows(dataType);
        }
        else {
          iVar12 = glu::getDataTypeMatrixNumColumns(dataType);
        }
      }
      uVar28 = (long)iVar11 / (long)iVar12 & 0xffffffff;
      if ((int)((long)iVar11 / (long)iVar12) < 1) {
        uVar28 = 0;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      if ((int)uVar7 < 1) {
        uVar17 = 0;
      }
      if ((int)uVar8 < 1) {
        uVar18 = 0;
      }
      for (uVar19 = 0; uVar19 != uVar18; uVar19 = uVar19 + 1) {
        iVar11 = pBVar5[iVar1].offset;
        for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
          for (iVar21 = 0; iVar21 != iVar12; iVar21 = iVar21 + 1) {
            lVar26 = (long)(pBVar5[iVar1].matrixStride * iVar21);
            if (!bVar31 && !bVar30) {
              lVar26 = 0;
            }
            lVar26 = lVar26 + (long)(iVar2 * (int)uVar20) +
                              (long)(iVar3 * (int)uVar19) + (long)iVar11;
            for (lVar29 = 0; uVar28 * 4 != lVar29; lVar29 = lVar29 + 4) {
              lVar27 = (long)(int)lVar29;
              if (DVar10 == TYPE_BOOL) {
                bVar9 = de::Random::getBool((Random *)&rnd.m_rnd);
                uVar24 = 0;
                if (bVar9) {
                  dVar13 = deRandom_getUint32(&rnd.m_rnd);
                  uVar24 = dVar13 | 1;
                }
                *(uint *)((long)pvVar6 + lVar27 + lVar26) = uVar24;
              }
              else {
                if (DVar10 == TYPE_INT) {
                  dVar13 = deRandom_getUint32(&rnd.m_rnd);
                  uVar24 = dVar13 % 0x13 - 9;
                }
                else {
                  if (DVar10 != TYPE_UINT) {
                    if (DVar10 == TYPE_FLOAT) {
                      dVar13 = deRandom_getUint32(&rnd.m_rnd);
                      *(float *)((long)pvVar6 + lVar27 + lVar26) = (float)(int)(dVar13 % 0x13 - 9);
                    }
                    goto LAB_013c6af0;
                  }
                  dVar13 = deRandom_getUint32(&rnd.m_rnd);
                  uVar24 = dVar13 % 10;
                }
                *(uint *)((long)pvVar6 + lVar27 + lVar26) = uVar24;
              }
LAB_013c6af0:
            }
          }
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void generateValues (const BufferLayout& layout, const vector<BlockDataPtr>& blockPointers, deUint32 seed)
{
	de::Random	rnd			(seed);
	const int	numBlocks	= (int)layout.blocks.size();

	DE_ASSERT(numBlocks == (int)blockPointers.size());

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout	= layout.blocks[blockNdx];
		const BlockDataPtr&		blockPtr	= blockPointers[blockNdx];
		const int				numEntries	= (int)layout.blocks[blockNdx].activeVarIndices.size();

		for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		{
			const int					varNdx		= blockLayout.activeVarIndices[entryNdx];
			const BufferVarLayoutEntry&	varEntry	= layout.bufferVars[varNdx];

			generateValue(varEntry, blockPtr.lastUnsizedArraySize, blockPtr.ptr, rnd);
		}
	}
}